

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void compute_U_UE_value_V5
               (string *user_password,string *encryption_key,EncryptionData *data,string *U,
               string *UE)

{
  string local_198;
  allocator<char> local_171;
  string local_170;
  undefined1 local_150 [8];
  string intermediate_key;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator local_a1;
  undefined1 local_a0 [8];
  string key_salt;
  allocator local_69;
  undefined1 local_68 [8];
  string validation_salt;
  char k [16];
  string *UE_local;
  string *U_local;
  EncryptionData *data_local;
  string *encryption_key_local;
  string *user_password_local;
  
  QUtil::initializeWithRandomBytes((uchar *)(validation_salt.field_2._M_local_buf + 8),0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,validation_salt.field_2._M_local_buf + 8,8,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a0,k,8,&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"",
             (allocator<char> *)(intermediate_key.field_2._M_local_buf + 0xf));
  hash_V5(&local_108,user_password,(string *)local_68,&local_128,data);
  std::operator+(&local_e8,&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::operator+(&local_c8,&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::__cxx11::string::operator=((string *)U,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)(intermediate_key.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"",&local_171);
  hash_V5((string *)local_150,user_password,(string *)local_a0,&local_170,data);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  process_with_aes(&local_198,(string *)local_150,true,encryption_key,0,1,(uchar *)0x0,0);
  std::__cxx11::string::operator=((string *)UE,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

static void
compute_U_UE_value_V5(
    std::string const& user_password,
    std::string const& encryption_key,
    QPDF::EncryptionData const& data,
    std::string& U,
    std::string& UE)
{
    // Algorithm 3.8 from the PDF 1.7 extension level 3
    char k[16];
    QUtil::initializeWithRandomBytes(reinterpret_cast<unsigned char*>(k), sizeof(k));
    std::string validation_salt(k, 8);
    std::string key_salt(k + 8, 8);
    U = hash_V5(user_password, validation_salt, "", data) + validation_salt + key_salt;
    std::string intermediate_key = hash_V5(user_password, key_salt, "", data);
    UE = process_with_aes(intermediate_key, true, encryption_key);
}